

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O3

string * __thiscall
cmExtraCodeLiteGenerator::GetCodeLiteCompilerName_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGlobalGenerator *this_00;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  string compilerId;
  string compilerIdVar;
  allocator local_71;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_CXX_COMPILER_ID","");
  this_00 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CXX","");
  bVar2 = cmGlobalGenerator::GetLanguageEnabled(this_00,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (!bVar2) {
    std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)local_50._M_string_length,0x501fbc);
  }
  pcVar4 = cmMakefile::GetSafeDefinition(mf,&local_50);
  std::__cxx11::string::string((string *)&local_70,pcVar4,&local_71);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar4 = "gnu g++";
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"gnu g++","");
  iVar3 = std::__cxx11::string::compare((char *)&local_70);
  if (iVar3 == 0) {
    pcVar4 = "VC++";
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_70);
    if (iVar3 == 0) {
      pcVar4 = "clang++";
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_70);
      if (iVar3 != 0) goto LAB_003beb18;
    }
  }
  std::__cxx11::string::_M_replace
            ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
             (ulong)pcVar4);
LAB_003beb18:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmExtraCodeLiteGenerator::GetCodeLiteCompilerName(const cmMakefile* mf) const
{
  // figure out which language to use
  // for now care only for C and C++
  std::string compilerIdVar = "CMAKE_CXX_COMPILER_ID";
  if (this->GlobalGenerator->GetLanguageEnabled("CXX") == false)
    {
    compilerIdVar = "CMAKE_C_COMPILER_ID";
    }

  std::string compilerId = mf->GetSafeDefinition(compilerIdVar);
  std::string compiler = "gnu g++"; // default to g++

  // Since we need the compiler for parsing purposes only
  // it does not matter if we use clang or clang++, same as
  // "gnu gcc" vs "gnu g++"
  if (compilerId == "MSVC")
    {
    compiler = "VC++";
    }
  else if (compilerId == "Clang")
    {
    compiler = "clang++";
    }
  else if (compilerId == "GNU")
    {
    compiler = "gnu g++";
    }
  return compiler;
}